

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<long_double,_3>::TPZManVector(TPZManVector<long_double,_3> *this,int64_t size)

{
  longdouble *plVar1;
  int64_t iVar2;
  
  TPZVec<long_double>::TPZVec(&this->super_TPZVec<long_double>,0);
  (this->super_TPZVec<long_double>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819fd8;
  if (size < 4) {
    plVar1 = this->fExtAlloc;
    iVar2 = 0;
  }
  else {
    plVar1 = (longdouble *)operator_new__(-(ulong)((ulong)size >> 0x3c != 0) | size << 4);
    iVar2 = size;
  }
  (this->super_TPZVec<long_double>).fStore = plVar1;
  (this->super_TPZVec<long_double>).fNElements = size;
  (this->super_TPZVec<long_double>).fNAlloc = iVar2;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}